

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::outputPostRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset)

{
  AggregateIndexes *pAVar1;
  ulong uVar2;
  string k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  bitset<7UL> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  AggregateIndexes *local_90;
  ulong local_88;
  string local_80;
  string local_60;
  size_t local_40;
  CppGenerator *local_38;
  
  local_b8 = increasing;
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_f8);
  local_88 = numOfAggs + 1;
  if (local_88 < 3) {
    local_90 = idx;
    local_40 = stringOffset;
    local_38 = this;
    for (uVar2 = 0; pAVar1 = local_90, local_88 != uVar2; uVar2 = uVar2 + 1) {
      offset_abi_cxx11_(&local_60,local_38,local_40);
      std::operator+(&local_d8,&local_60,"postRegister[");
      std::__cxx11::to_string(&local_80,pAVar1->indexes[2] + uVar2);
      std::operator+(&local_b0,&local_d8,&local_80);
      std::operator+(&local_f8,&local_b0,"] += ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_60);
      if (((pAVar1->present).super__Base_bitset<1UL>._M_w & 1) == 0) {
        std::operator<<((ostream *)&std::cerr,"WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
      }
      else {
        std::__cxx11::to_string
                  (&local_d8,
                   (-(ulong)((uint)(local_b8->super__Base_bitset<1UL>)._M_w & 1) & uVar2) +
                   pAVar1->indexes[0]);
        std::operator+(&local_b0,"aggregateRegister[",&local_d8);
        std::operator+(&local_f8,&local_b0,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      if (((local_90->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
        std::__cxx11::to_string
                  (&local_d8,
                   ((long)((local_b8->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar2) +
                   local_90->indexes[1]);
        std::operator+(&local_b0,"postRegister[",&local_d8);
        std::operator+(&local_f8,&local_b0,"]*");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      std::__cxx11::string::pop_back();
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    offset_abi_cxx11_(&local_60,this,stringOffset);
    std::operator+(&local_d8,&local_60,"for (size_t i = 0; i < ");
    std::__cxx11::to_string(&local_80,local_88);
    std::operator+(&local_b0,&local_d8,&local_80);
    std::operator+(&local_f8,&local_b0,";++i)\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_60);
    offset_abi_cxx11_(&local_60,this,stringOffset + 1);
    std::operator+(&local_d8,&local_60,"postRegister[");
    std::__cxx11::to_string(&local_80,idx->indexes[2]);
    std::operator+(&local_b0,&local_d8,&local_80);
    std::operator+(&local_f8,&local_b0,"+i] += ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_60);
    uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
    if ((uVar2 & 1) != 0) {
      std::__cxx11::to_string(&local_f8,idx->indexes[0]);
      if (((local_b8->super__Base_bitset<1UL>)._M_w & 1) != 0) {
        std::__cxx11::string::append((char *)&local_f8);
      }
      std::operator+(&local_d8,"aggregateRegister[",&local_f8);
      std::operator+(&local_b0,&local_d8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      uVar2 = (idx->present).super__Base_bitset<1UL>._M_w;
    }
    if ((uVar2 & 2) != 0) {
      std::__cxx11::to_string(&local_f8,idx->indexes[1]);
      if (((local_b8->super__Base_bitset<1UL>)._M_w & 2) != 0) {
        std::__cxx11::string::append((char *)&local_f8);
      }
      std::operator+(&local_d8,"postRegister[",&local_f8);
      std::operator+(&local_b0,&local_d8,"]*");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::outputPostRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs+1 > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";
        outString += offset(stringOffset+1)+
            "postRegister["+std::to_string(idx.indexes[2])+"+i] += ";
        
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            outString +="aggregateRegister["+k+"]*";
        }
        // else
        // {
        //     ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
        //     //  exit(1);
        // }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            outString +="postRegister["+k+"]*";
        }
        
        outString.pop_back();
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            // We use a mapping to the correct index
            outString += offset(stringOffset)+
                "postRegister["+std::to_string(idx.indexes[2]+i)+"] += ";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                outString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            else
            {
                ERROR("WE EXPECT LOCAL IN POST REG TO BE SET!! \n");
                // exit(1);
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                outString +="postRegister["+std::to_string(k)+"]*";
            }
            
            outString.pop_back();
            outString += ";\n";
        }
    }

    return outString;
}